

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

int __thiscall
cmCTest::Run(cmCTest *this,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *args,string *output)

{
  pointer pbVar1;
  pointer pcVar2;
  cmCTest *pcVar3;
  pointer ppcVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  undefined7 uVar13;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var14;
  pointer ppcVar15;
  undefined1 auVar16 [16];
  initializer_list<cmCTestGenericHandler_*> __l;
  bool SRArgumentSpecified;
  string errormsg;
  string arg;
  string targ;
  bool local_249;
  size_t local_248;
  uint local_240;
  int local_23c;
  ulong local_238;
  cmCTest *local_230;
  string local_228;
  long *local_208 [2];
  long local_1f8 [2];
  vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> local_1e8;
  long *local_1d0 [2];
  long local_1c0 [2];
  string *local_1b0;
  string local_1a8;
  cmCTestTestHandler *local_188;
  long lStack_180;
  cmCTestConfigureHandler *local_178;
  long lStack_170;
  cmCTestSubmitHandler *local_168;
  cmCTestUploadHandler *local_160;
  ios_base local_138 [264];
  
  local_249 = false;
  _Var14._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  local_1b0 = output;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(_Var14._M_head_impl)->InitialCommandLineArguments,
             ((_Var14._M_head_impl)->InitialCommandLineArguments).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  local_248 = 1;
  uVar12 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  uVar13 = (undefined7)(uVar12 >> 8);
  if (uVar12 < 0x21) {
    local_240 = (uint)CONCAT71(uVar13,1);
    local_238 = 0;
  }
  else {
    local_240 = (uint)CONCAT71(uVar13,1);
    local_238 = 0;
    local_230 = this;
    do {
      pcVar3 = local_230;
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      local_228._M_string_length = 0;
      local_228.field_2._M_local_buf[0] = '\0';
      bVar6 = HandleCommandLineArguments(local_230,&local_248,args,&local_228);
      if (bVar6) {
        HandleScriptArguments(pcVar3,&local_248,args,&local_249);
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pcVar2 = pbVar1[local_248]._M_dataplus._M_p;
        local_208[0] = local_1f8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_208,pcVar2,pcVar2 + pbVar1[local_248]._M_string_length);
        iVar10 = std::__cxx11::string::compare((char *)local_208);
        if (((iVar10 == 0) ||
            (iVar10 = std::__cxx11::string::compare((char *)local_208), iVar10 == 0)) &&
           (pbVar1 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
           local_248 <
           ((long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U)) {
          ((pcVar3->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ProduceXML = true;
          local_248 = local_248 + 1;
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          pcVar2 = pbVar1[local_248]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a8,pcVar2,pcVar2 + pbVar1[local_248]._M_string_length);
          bVar6 = AddTestsForDashboardType(pcVar3,&local_1a8);
          if ((!bVar6) && (bVar6 = AddVariableDefinition(pcVar3,&local_1a8), !bVar6)) {
            ErrorMessageUnknownDashDValue(pcVar3,&local_1a8);
            local_240 = 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,
                            (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
          }
        }
        iVar10 = std::__cxx11::string::compare((char *)local_208);
        if ((iVar10 != 0) &&
           (bVar6 = cmsys::SystemTools::StringStartsWith((char *)local_208[0],"-D"), bVar6)) {
          std::__cxx11::string::substr((ulong)&local_1a8,(ulong)local_208);
          AddVariableDefinition(pcVar3,&local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,
                            (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
          }
        }
        bVar7 = HandleTestActionArgument(pcVar3,"ctest",&local_248,args);
        bVar8 = HandleTestModelArgument(pcVar3,"ctest",&local_248,args);
        iVar10 = std::__cxx11::string::compare((char *)local_208);
        pcVar3 = local_230;
        if ((iVar10 == 0) &&
           (local_248 <
            ((long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
          ((local_230->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ProduceXML = true;
          SetTest(local_230,"Submit",true);
          local_248 = local_248 + 1;
          bVar9 = SubmitExtraFiles(pcVar3,(args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start[local_248].
                                          _M_dataplus._M_p);
          bVar6 = false;
          if (bVar9) goto LAB_00151af5;
          local_23c = 0;
        }
        else {
LAB_00151af5:
          iVar10 = std::__cxx11::string::compare((char *)local_208);
          if (iVar10 == 0) {
            local_238 = CONCAT71((int7)(local_238 >> 8),
                                 (byte)local_238 |
                                 local_248 <
                                 ((long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U);
          }
          iVar10 = std::__cxx11::string::compare((char *)local_208);
          pcVar3 = local_230;
          if (iVar10 == 0) {
            _Var14._M_head_impl =
                 (local_230->Impl)._M_t.
                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
                 super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
            std::__cxx11::string::_M_replace
                      ((ulong)&(_Var14._M_head_impl)->ScheduleType,0,
                       (char *)((_Var14._M_head_impl)->ScheduleType)._M_string_length,0x596092);
          }
          _Var14._M_head_impl =
               (pcVar3->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
          auVar16._8_4_ = (int)_Var14._M_head_impl;
          auVar16._0_8_ = _Var14._M_head_impl;
          auVar16._12_4_ = (int)((ulong)_Var14._M_head_impl >> 0x20);
          lStack_170 = auVar16._8_8_;
          local_1a8._M_dataplus._M_p = (pointer)&(_Var14._M_head_impl)->BuildHandler;
          local_1a8._M_string_length = lStack_170 + 0x418;
          local_1a8.field_2._M_allocated_capacity =
               (size_type)&(_Var14._M_head_impl)->CoverageHandler;
          local_1a8.field_2._8_8_ = lStack_170 + 0x850;
          local_188 = &(_Var14._M_head_impl)->TestHandler;
          lStack_180 = lStack_170 + 0x1298;
          local_178 = &(_Var14._M_head_impl)->ConfigureHandler;
          lStack_170 = lStack_170 + 0x13f0;
          local_168 = &(_Var14._M_head_impl)->SubmitHandler;
          local_160 = &(_Var14._M_head_impl)->UploadHandler;
          __l._M_len = 10;
          __l._M_array = (iterator)&local_1a8;
          std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::vector
                    (&local_1e8,__l,(allocator_type *)local_1d0);
          ppcVar4 = local_1e8.
                    super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          ppcVar15 = local_1e8.
                     super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (local_1e8.
              super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              local_1e8.
              super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            bVar6 = true;
          }
          else {
            do {
              iVar10 = (*(*ppcVar15)->_vptr_cmCTestGenericHandler[2])
                                 (*ppcVar15,(string *)local_208,&local_248,args);
              bVar6 = iVar10 != 0;
              if (iVar10 == 0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8,
                           "Problem parsing command line arguments within a handler",0x37);
                std::__cxx11::stringbuf::str();
                Log(local_230,7,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
                    ,0x8e2,(char *)local_1d0[0],false);
                if (local_1d0[0] != local_1c0) {
                  operator_delete(local_1d0[0],local_1c0[0] + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
                std::ios_base::~ios_base(local_138);
                local_23c = 0;
                break;
              }
              ppcVar15 = ppcVar15 + 1;
            } while (ppcVar15 != ppcVar4);
          }
          if (local_1e8.
              super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1e8.
                            super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_1e8.
                                  super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1e8.
                                  super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        if (local_208[0] != local_1f8) {
          operator_delete(local_208[0],local_1f8[0] + 1);
        }
        local_240 = CONCAT31((int3)(local_240 >> 8),(byte)local_240 & (bVar7 && bVar8));
      }
      else {
        cmSystemTools::Error(&local_228);
        local_23c = 1;
        bVar6 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,
                        CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                 local_228.field_2._M_local_buf[0]) + 1);
      }
      if (!bVar6) {
        return local_23c;
      }
      local_248 = local_248 + 1;
      this = local_230;
    } while (local_248 <
             (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  _Var14._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  if ((_Var14._M_head_impl)->ParallelLevelSetInCli == false) {
    local_1a8._M_string_length = 0;
    local_1a8.field_2._M_allocated_capacity =
         local_1a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    bVar6 = cmsys::SystemTools::GetEnv("CTEST_PARALLEL_LEVEL",&local_1a8);
    _Var5._M_p = local_1a8._M_dataplus._M_p;
    if (bVar6) {
      iVar11 = atoi(local_1a8._M_dataplus._M_p);
      iVar10 = 1;
      if (1 < iVar11) {
        iVar10 = iVar11;
      }
      ((this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ParallelLevel = iVar10;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p != &local_1a8.field_2) {
      operator_delete(_Var5._M_p,(ulong)(local_1a8.field_2._M_allocated_capacity + 1));
    }
    _Var14._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  }
  if (((_Var14._M_head_impl)->TestProgressOutput == true) &&
     ((_Var14._M_head_impl)->OutputLogFile == (cmGeneratedFileStream *)0x0)) {
    bVar6 = ConsoleIsNotDumb();
    _Var14._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  }
  else {
    bVar6 = false;
  }
  (_Var14._M_head_impl)->TestProgressOutput = bVar6;
  if ((local_238 & 1) == 0) {
    iVar10 = 1;
    if ((local_240 & 1) != 0) {
      iVar10 = ExecuteTests(this);
    }
  }
  else {
    iVar10 = RunCMakeAndTest(this,local_1b0);
  }
  return iVar10;
}

Assistant:

int cmCTest::Run(std::vector<std::string>& args, std::string* output)
{
  const char* ctestExec = "ctest";
  bool cmakeAndTest = false;
  bool executeTests = true;
  bool SRArgumentSpecified = false;

  // copy the command line
  cmAppend(this->Impl->InitialCommandLineArguments, args);

  // process the command line arguments
  for (size_t i = 1; i < args.size(); ++i) {
    // handle the simple commandline arguments
    std::string errormsg;
    if (!this->HandleCommandLineArguments(i, args, errormsg)) {
      cmSystemTools::Error(errormsg);
      return 1;
    }

    // handle the script arguments -S -SR -SP
    this->HandleScriptArguments(i, args, SRArgumentSpecified);

    // --dashboard: handle a request for a dashboard
    std::string arg = args[i];
    if (this->CheckArgument(arg, "-D", "--dashboard") && i < args.size() - 1) {
      this->Impl->ProduceXML = true;
      i++;
      std::string targ = args[i];
      // AddTestsForDashboard parses the dashboard type and converts it
      // into the separate stages
      if (!this->AddTestsForDashboardType(targ)) {
        if (!this->AddVariableDefinition(targ)) {
          this->ErrorMessageUnknownDashDValue(targ);
          executeTests = false;
        }
      }
    }

    // If it's not exactly -D, but it starts with -D, then try to parse out
    // a variable definition from it, same as CMake does. Unsuccessful
    // attempts are simply ignored since previous ctest versions ignore
    // this too. (As well as many other unknown command line args.)
    //
    if (arg != "-D" && cmSystemTools::StringStartsWith(arg.c_str(), "-D")) {
      std::string input = arg.substr(2);
      this->AddVariableDefinition(input);
    }

    // --test-action: calls SetTest(<stage>, /*report=*/ false) to enable
    // the corresponding stage
    if (!this->HandleTestActionArgument(ctestExec, i, args)) {
      executeTests = false;
    }

    // --test-model: what type of test model
    if (!this->HandleTestModelArgument(ctestExec, i, args)) {
      executeTests = false;
    }

    // --extra-submit
    if (this->CheckArgument(arg, "--extra-submit") && i < args.size() - 1) {
      this->Impl->ProduceXML = true;
      this->SetTest("Submit");
      i++;
      if (!this->SubmitExtraFiles(args[i].c_str())) {
        return 0;
      }
    }

    // --build-and-test options
    if (this->CheckArgument(arg, "--build-and-test") && i < args.size() - 1) {
      cmakeAndTest = true;
    }

    // --schedule-random
    if (this->CheckArgument(arg, "--schedule-random")) {
      this->Impl->ScheduleType = "Random";
    }

    // pass the argument to all the handlers as well, but i may no longer be
    // set to what it was originally so I'm not sure this is working as
    // intended
    for (auto& handler : this->Impl->GetTestingHandlers()) {
      if (!handler->ProcessCommandLineArguments(arg, i, args)) {
        cmCTestLog(this, ERROR_MESSAGE,
                   "Problem parsing command line arguments within a handler");
        return 0;
      }
    }
  } // the close of the for argument loop

  // handle CTEST_PARALLEL_LEVEL environment variable
  if (!this->Impl->ParallelLevelSetInCli) {
    std::string parallel;
    if (cmSystemTools::GetEnv("CTEST_PARALLEL_LEVEL", parallel)) {
      int plevel = atoi(parallel.c_str());
      this->SetParallelLevel(plevel);
    }
  }

  // TestProgressOutput only supported if console supports it and not logging
  // to a file
  this->Impl->TestProgressOutput = this->Impl->TestProgressOutput &&
    !this->Impl->OutputLogFile && this->ProgressOutputSupportedByConsole();
#ifdef _WIN32
  if (this->Impl->TestProgressOutput) {
    // Disable output line buffering so we can print content without
    // a newline.
    std::setvbuf(stdout, nullptr, _IONBF, 0);
  }
#endif

  // now what should cmake do? if --build-and-test was specified then
  // we run the build and test handler and return
  if (cmakeAndTest) {
    return this->RunCMakeAndTest(output);
  }

  if (executeTests) {
    return this->ExecuteTests();
  }

  return 1;
}